

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eia608.c
# Opt level: O2

uint16_t eia608_from_utf8_2(utf8_char_t *c1,utf8_char_t *c2)

{
  uint16_t uVar1;
  uint16_t bna2;
  
  uVar1 = _eia608_from_utf8(c1);
  bna2 = _eia608_from_utf8(c2);
  uVar1 = eia608_from_basicna(uVar1,bna2);
  return uVar1;
}

Assistant:

uint16_t eia608_from_utf8_2(const utf8_char_t* c1, const utf8_char_t* c2)
{
    uint16_t cc1 = _eia608_from_utf8(c1);
    uint16_t cc2 = _eia608_from_utf8(c2);
    return eia608_from_basicna(cc1, cc2);
}